

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derTDec(u32 *tag,octet *der,size_t count)

{
  byte *pbVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  
  sVar3 = 0xffffffffffffffff;
  if (count != 0) {
    sVar7 = 4;
    if (count < 4) {
      sVar7 = count;
    }
    bVar2 = *der;
    uVar5 = (uint)bVar2;
    if ((~bVar2 & 0x1f) == 0) {
      if ((count == 1) || (uVar8 = 0, (der[1] & 0x7f) == 0)) {
        return 0;
      }
      sVar6 = 1;
      do {
        sVar3 = sVar7;
        if (sVar7 == sVar6) break;
        pbVar1 = der + sVar6;
        uVar8 = uVar8 << 8 | *pbVar1 & 0x7f;
        sVar3 = sVar6 + 1;
        sVar6 = sVar3;
      } while ((char)*pbVar1 < '\0');
      if (sVar3 == sVar7) {
        return 0xffffffffffffffff;
      }
      if (uVar8 < 0x1f) {
        return 0xffffffffffffffff;
      }
    }
    else {
      sVar3 = 1;
      if (bVar2 == 0) {
        return 0xffffffffffffffff;
      }
    }
    if (tag != (u32 *)0x0) {
      if (1 < sVar3) {
        uVar4 = 1;
        do {
          uVar5 = uVar5 << 8 | (uint)der[uVar4];
          uVar4 = uVar4 + 1;
        } while (sVar3 != uVar4);
      }
      *tag = uVar5;
    }
  }
  return sVar3;
}

Assistant:

static size_t derTDec(u32* tag, const octet der[], size_t count)
{
	u32 t;
	size_t t_count = 1;
	// обработать длину кода
	if (count < 1)
		return SIZE_MAX;
	ASSERT(memIsValid(der, count));
	count = MIN2(4, count);
	// длинный код?
	if ((der[0] & 31) == 31)
	{
		// короткий код? лишний октет с нулем?
		if (count < 2 || (der[1] & 127) == 0)
			return FALSE;
		for (t = 0; t_count < count;)
		{
			t <<= 8, t |= der[t_count] & 127;
			// завершающий октет?
			if ((der[t_count++] & 128) == 0)
				break;
		}
		// завершающий октет не найден?
		// можно было обойтись коротким кодом?
		if (t_count == count || t < 31)
			return SIZE_MAX;
	}
	// нулевой тег?
	else if (der[0] == 0)
		return SIZE_MAX;
	// возврат 
	if (tag)
	{
		size_t pos;
		ASSERT(memIsValid(tag, 4));
		for (t = der[0], pos = 1; pos < t_count; ++pos)
			t <<= 8, t |= der[pos];
		*tag = t;		
	}
	return t_count;
}